

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O1

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  int i;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  uint uVar15;
  long lVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int i_2;
  long lVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  
  iVar1 = bottom_top_blob->dims;
  uVar11 = (long)this->channels / (long)this->group;
  uVar9 = uVar11 & 0xffffffff;
  iVar8 = (int)uVar11;
  if (iVar1 == 2) {
    iVar2 = this->group;
    if (0 < (long)iVar2) {
      uVar15 = bottom_top_blob->w;
      uVar11 = (ulong)uVar15;
      pvVar10 = bottom_top_blob->data;
      pvVar13 = (this->gamma_data).data;
      sVar4 = (this->gamma_data).elemsize;
      pvVar14 = (this->beta_data).data;
      sVar5 = (this->beta_data).elemsize;
      iVar3 = this->affine;
      fVar24 = 1.0 / (float)(int)(uVar15 * iVar8);
      lVar22 = (long)bottom_top_blob->w * bottom_top_blob->elemsize;
      lVar16 = 0;
      do {
        fVar25 = 0.0;
        fVar26 = 0.0;
        if (0 < iVar8) {
          uVar20 = 0;
          pvVar17 = pvVar10;
          do {
            if (0 < (int)uVar15) {
              uVar12 = 0;
              do {
                fVar26 = fVar26 + *(float *)((long)pvVar17 + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
            }
            uVar20 = uVar20 + 1;
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar20 != uVar9);
        }
        fVar26 = fVar26 * fVar24;
        if (0 < iVar8) {
          fVar25 = 0.0;
          uVar20 = 0;
          pvVar17 = pvVar10;
          do {
            if (0 < (int)uVar15) {
              uVar12 = 0;
              do {
                fVar28 = *(float *)((long)pvVar17 + uVar12 * 4) - fVar26;
                fVar25 = fVar25 + fVar28 * fVar28;
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
            }
            uVar20 = uVar20 + 1;
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar20 != uVar9);
        }
        if (0 < iVar8) {
          lVar18 = lVar16 * iVar8;
          fVar25 = fVar25 * fVar24;
          uVar20 = 0;
          pvVar17 = pvVar10;
          do {
            if (iVar3 == 0) {
              fVar29 = this->eps + fVar25;
              auVar27 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar29));
              fVar28 = auVar27._0_4_;
              fVar28 = fVar28 * -0.5 * (fVar29 * fVar28 * fVar28 + -3.0);
              fVar29 = fVar28 * -fVar26;
            }
            else {
              fVar29 = this->eps + fVar25;
              auVar27 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar29));
              fVar28 = auVar27._0_4_;
              fVar28 = fVar28 * -0.5 * (fVar29 * fVar28 * fVar28 + -3.0) *
                       *(float *)((long)pvVar13 + uVar20 * 4 + sVar4 * lVar18);
              fVar29 = *(float *)((long)pvVar14 + uVar20 * 4 + lVar18 * sVar5) - fVar28 * fVar26;
            }
            if (0 < (int)uVar15) {
              uVar12 = 0;
              do {
                *(float *)((long)pvVar17 + uVar12 * 4) =
                     *(float *)((long)pvVar17 + uVar12 * 4) * fVar28 + fVar29;
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
            }
            uVar20 = uVar20 + 1;
            pvVar17 = (void *)((long)pvVar17 + lVar22);
          } while (uVar20 != uVar9);
        }
        lVar16 = lVar16 + 1;
        pvVar10 = (void *)((long)pvVar10 + lVar22 * iVar8);
      } while (lVar16 != iVar2);
    }
  }
  else if ((iVar1 == 1) && (iVar2 = this->group, 0 < (long)iVar2)) {
    pvVar10 = bottom_top_blob->data;
    pvVar13 = (this->gamma_data).data;
    pvVar14 = (this->beta_data).data;
    iVar3 = this->affine;
    lVar16 = (long)iVar8;
    uVar11 = uVar11 & 0xffffffff;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = (this->beta_data).elemsize;
    sVar6 = (this->gamma_data).elemsize;
    lVar22 = 0;
    do {
      fVar24 = 0.0;
      fVar25 = 0.0;
      if (0 < iVar8) {
        uVar20 = 0;
        do {
          fVar25 = fVar25 + *(float *)((long)pvVar10 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      fVar25 = fVar25 * (1.0 / (float)iVar8);
      if (0 < iVar8) {
        fVar24 = 0.0;
        uVar20 = 0;
        do {
          fVar26 = *(float *)((long)pvVar10 + uVar20 * 4) - fVar25;
          fVar24 = fVar24 + fVar26 * fVar26;
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      if (0 < iVar8) {
        fVar24 = fVar24 * (1.0 / (float)iVar8);
        uVar20 = 0;
        do {
          if (iVar3 == 0) {
            fVar28 = this->eps + fVar24;
            auVar27 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar28));
            fVar26 = auVar27._0_4_;
            fVar26 = fVar26 * -0.5 * (fVar28 * fVar26 * fVar26 + -3.0);
            fVar28 = fVar26 * -fVar25;
          }
          else {
            fVar28 = this->eps + fVar24;
            auVar27 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar28));
            fVar26 = auVar27._0_4_;
            fVar26 = fVar26 * -0.5 * (fVar28 * fVar26 * fVar26 + -3.0) *
                     *(float *)((long)pvVar13 + uVar20 * 4);
            fVar28 = *(float *)((long)pvVar14 + uVar20 * 4) - fVar26 * fVar25;
          }
          *(float *)((long)pvVar10 + uVar20 * 4) =
               fVar26 * *(float *)((long)pvVar10 + uVar20 * 4) + fVar28;
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      lVar22 = lVar22 + 1;
      pvVar10 = (void *)((long)pvVar10 + sVar4 * lVar16);
      pvVar14 = (void *)((long)pvVar14 + sVar5 * lVar16);
      pvVar13 = (void *)((long)pvVar13 + lVar16 * sVar6);
    } while (lVar22 != iVar2);
  }
  if ((iVar1 - 3U < 2) && (iVar1 = this->group, 0 < (long)iVar1)) {
    uVar15 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar10 = bottom_top_blob->data;
    uVar11 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    lVar22 = 0;
    pvVar13 = (this->gamma_data).data;
    sVar5 = (this->gamma_data).elemsize;
    pvVar14 = (this->beta_data).data;
    sVar6 = (this->beta_data).elemsize;
    lVar16 = (((long)bottom_top_blob->d * uVar11 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
             uVar11) * uVar11;
    iVar2 = this->affine;
    uVar20 = (ulong)uVar15;
    fVar24 = 1.0 / (float)(int)(uVar15 * iVar8);
    do {
      lVar19 = lVar22 * iVar8;
      lVar18 = sVar4 * uVar11 * lVar19;
      fVar25 = 0.0;
      fVar26 = 0.0;
      if (0 < iVar8) {
        uVar12 = 0;
        do {
          if (0 < (int)uVar15) {
            lVar23 = 0;
            uVar7 = uVar20;
            do {
              fVar26 = fVar26 + *(float *)((long)pvVar10 + lVar23 * 4 + lVar16 * uVar12 + lVar18);
              lVar23 = lVar23 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      fVar26 = fVar26 * fVar24;
      if (0 < iVar8) {
        fVar25 = 0.0;
        uVar12 = 0;
        do {
          if (0 < (int)uVar15) {
            lVar23 = 0;
            uVar7 = uVar20;
            do {
              fVar28 = *(float *)((long)pvVar10 + lVar23 * 4 + lVar16 * uVar12 + lVar18) - fVar26;
              fVar25 = fVar25 + fVar28 * fVar28;
              lVar23 = lVar23 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      if (0 < iVar8) {
        fVar25 = fVar25 * fVar24;
        uVar12 = 0;
        do {
          if (iVar2 == 0) {
            fVar29 = this->eps + fVar25;
            auVar27 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar29));
            fVar28 = auVar27._0_4_;
            fVar28 = fVar28 * -0.5 * (fVar29 * fVar28 * fVar28 + -3.0);
            fVar29 = fVar28 * -fVar26;
          }
          else {
            fVar29 = this->eps + fVar25;
            auVar27 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar29));
            fVar28 = auVar27._0_4_;
            fVar28 = fVar28 * -0.5 * (fVar29 * fVar28 * fVar28 + -3.0) *
                     *(float *)((long)pvVar13 + uVar12 * 4 + sVar5 * lVar19);
            fVar29 = *(float *)((long)pvVar14 + uVar12 * 4 + lVar19 * sVar6) - fVar28 * fVar26;
          }
          if (0 < (int)uVar15) {
            lVar23 = lVar16 * uVar12 + lVar18;
            lVar21 = 0;
            uVar7 = uVar20;
            do {
              *(float *)((long)pvVar10 + lVar21 * 4 + lVar23) =
                   *(float *)((long)pvVar10 + lVar21 * 4 + lVar23) * fVar28 + fVar29;
              lVar21 = lVar21 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != iVar1);
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                sum += bottom_top_blob_g[q];
            }
            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                float tmp = bottom_top_blob_g[q] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / channels_per_group;

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                bottom_top_blob_g[q] = bottom_top_blob_g[q] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * w);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * w);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * size);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}